

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_pvrtc1_4.cpp
# Opt level: O3

uint64_t __thiscall
basisu::pvrtc4_image::local_endpoint_optimization_opaque
          (pvrtc4_image *this,uint32_t bx,uint32_t by,image *orig_img,bool perceptual)

{
  byte bVar1;
  byte bVar2;
  uint32_t uVar3;
  color_rgba *pcVar4;
  pvrtc4_block *ppVar5;
  bool bVar6;
  pvrtc4_image *this_00;
  uint32_t i;
  int iVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  byte bVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  int y_1;
  int iVar22;
  float *pfVar23;
  uint uVar24;
  ulong uVar25;
  undefined7 in_register_00000081;
  long lVar26;
  uint uVar27;
  ulong *puVar28;
  uint uVar29;
  ulong uVar30;
  int y;
  int iVar31;
  ulong uVar32;
  uint32_t i_5;
  uint uVar33;
  uint32_t uVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float d2;
  undefined1 auVar38 [16];
  float d2_1;
  vec3F c_avg_orig;
  vec3F quant_colors [2];
  float total_weight [2];
  pvrtc4_block blocks0 [3] [3];
  pvrtc4_block cur_blocks [3] [3];
  vec<3U,_float> res;
  ulong local_178;
  float local_170;
  undefined8 local_168;
  float fStack_160;
  ulong uStack_15c;
  float local_154;
  ulong local_148;
  uint64_t local_140;
  image *local_138;
  ulong local_130;
  float local_128 [2];
  ulong local_120;
  pvrtc4_image *local_118;
  ulong local_110;
  uint local_104;
  uint local_100;
  uint local_fc;
  uint local_f8;
  undefined4 local_f4;
  uint64_t local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  float local_88 [19];
  float afStack_3c [3];
  
  uVar17 = (ulong)by;
  uVar25 = (ulong)bx;
  iVar31 = 0;
  local_f4 = (undefined4)CONCAT71(in_register_00000081,perceptual);
  local_f0 = evaluate_1x1_endpoint_error(this,bx,by,orig_img,perceptual,false,0);
  if (local_f0 == 0) {
    return 0;
  }
  iVar7 = by * 4 + -1;
  uVar34 = this->m_width;
  uVar19 = this->m_height;
  uVar32 = (ulong)uVar19;
  uVar33 = orig_img->m_width;
  uVar27 = orig_img->m_height;
  uVar3 = orig_img->m_pitch;
  uVar29 = (orig_img->m_pixels).m_size;
  pcVar4 = (orig_img->m_pixels).m_p;
  fVar36 = 0.0;
  fVar37 = 0.0;
  fVar35 = 0.0;
  do {
    uVar15 = iVar7 + iVar31;
    if ((int)uVar15 < 0) {
      iVar22 = (int)uVar15 % (int)uVar19;
      uVar15 = iVar22 + uVar19;
      if (iVar22 == 0) {
        uVar15 = 0;
      }
    }
    else if ((int)uVar19 <= (int)uVar15) {
      uVar15 = (int)uVar15 % (int)uVar19;
    }
    iVar22 = -1;
    do {
      uVar8 = bx * 4 + iVar22;
      if ((int)uVar8 < 0) {
        iVar18 = (int)uVar8 % (int)uVar34;
        uVar8 = iVar18 + uVar34;
        if (iVar18 == 0) {
          uVar8 = 0;
        }
      }
      else if ((int)uVar34 <= (int)uVar8) {
        uVar8 = (int)uVar8 % (int)uVar34;
      }
      local_138 = orig_img;
      local_130 = uVar17;
      local_118 = this;
      local_110 = uVar25;
      if ((uVar33 <= uVar8) || (uVar27 <= uVar15)) {
LAB_0024beb3:
        __assert_fail("x < m_width && y < m_height",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                      ,0xb00,"const color_rgba &basisu::image::operator()(uint32_t, uint32_t) const"
                     );
      }
      uVar8 = uVar8 + uVar3 * uVar15;
      if (uVar29 <= uVar8) {
LAB_0024be94:
        __assert_fail("i < m_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                      ,0x177,
                      "const T &basisu::vector<basisu::color_rgba>::operator[](size_t) const [T = basisu::color_rgba]"
                     );
      }
      auVar38 = pmovzxbd(ZEXT216(*(ushort *)&pcVar4[uVar8].field_0),
                         ZEXT216(*(ushort *)&pcVar4[uVar8].field_0));
      fVar36 = fVar36 + (float)auVar38._0_4_;
      fVar37 = fVar37 + (float)auVar38._4_4_;
      fVar35 = fVar35 + (float)pcVar4[uVar8].field_0.m_comps[2];
      iVar22 = iVar22 + 1;
    } while (iVar22 != 6);
    iVar31 = iVar31 + 1;
  } while (iVar31 != 7);
  local_178 = CONCAT44(fVar37,fVar36);
  local_170 = fVar35;
  lVar9 = 0;
  do {
    *(float *)((long)&local_178 + lVar9 * 4) =
         *(float *)((long)&local_178 + lVar9 * 4) * 0.020408163;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  fStack_160 = local_170;
  local_168 = local_178;
  local_88[0] = 0.0125;
  local_88[1] = 0.0125;
  local_88[2] = 0.0125;
  lVar9 = 0;
  do {
    *(float *)((long)&local_168 + lVar9 * 4) =
         *(float *)((long)&local_168 + lVar9 * 4) - local_88[lVar9];
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  uStack_15c = local_178;
  local_154 = local_170;
  local_88[0] = 0.0125;
  local_88[1] = 0.0125;
  local_88[2] = 0.0125;
  local_88._8_8_ = CONCAT44(local_88[3],local_88[2]);
  lVar9 = 3;
  do {
    *(float *)((long)&local_168 + lVar9 * 4) =
         *(float *)((long)&local_98 + lVar9 * 4 + 4) + *(float *)((long)&local_168 + lVar9 * 4);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 6);
  bVar14 = 1;
  iVar31 = 0;
  do {
    local_148 = CONCAT71(local_148._1_7_,bVar14);
    local_88[0] = 0.0;
    local_88[1] = 0.0;
    local_88[2] = 0.0;
    local_88[3] = 0.0;
    local_88[4] = 0.0;
    local_88[5] = 0.0;
    local_128[0] = 0.0;
    local_128[1] = 0.0;
    lVar9 = 0;
    do {
      uVar15 = iVar7 + (int)lVar9;
      if ((int)uVar15 < 0) {
        iVar22 = (int)uVar15 % (int)uVar19;
        uVar15 = iVar22 + uVar19;
        if (iVar22 == 0) {
          uVar15 = 0;
        }
      }
      else if ((int)uVar19 <= (int)uVar15) {
        uVar15 = (int)uVar15 % (int)uVar19;
      }
      lVar26 = 0;
      do {
        uVar8 = bx * 4 + -1 + (int)lVar26;
        if ((int)uVar8 < 0) {
          iVar22 = (int)uVar8 % (int)uVar34;
          uVar8 = iVar22 + uVar34;
          if (iVar22 == 0) {
            uVar8 = 0;
          }
        }
        else if ((int)uVar34 <= (int)uVar8) {
          uVar8 = (int)uVar8 % (int)uVar34;
        }
        local_140 = uVar32;
        if ((uVar33 <= uVar8) || (uVar27 <= uVar15)) goto LAB_0024beb3;
        uVar8 = uVar8 + uVar3 * uVar15;
        if (uVar29 <= uVar8) goto LAB_0024be94;
        auVar38 = pmovzxbd(ZEXT216(*(ushort *)&pcVar4[uVar8].field_0),
                           ZEXT216(*(ushort *)&pcVar4[uVar8].field_0));
        local_d8 = CONCAT44((float)auVar38._4_4_,(float)auVar38._0_4_);
        uStack_d0 = CONCAT44(uStack_d0._4_4_,(float)pcVar4[uVar8].field_0.m_comps[2]);
        fVar35 = 0.0;
        lVar10 = 0;
        do {
          fVar36 = *(float *)((long)&local_168 + lVar10 * 4) -
                   *(float *)((long)&local_d8 + lVar10 * 4);
          fVar35 = fVar35 + fVar36 * fVar36;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 3);
        fVar36 = 0.0;
        lVar10 = 0;
        do {
          fVar37 = *(float *)((long)&uStack_15c + lVar10 * 4) -
                   *(float *)((long)&local_d8 + lVar10 * 4);
          fVar36 = fVar36 + fVar37 * fVar37;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 3);
        fVar37 = local_endpoint_optimization_opaque::s_weights[lVar9][lVar26];
        lVar10 = 0;
        do {
          afStack_3c[lVar10] = *(float *)((long)&local_d8 + lVar10 * 4) * fVar37;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 3);
        bVar6 = fVar36 < fVar35;
        lVar10 = 0;
        do {
          local_88[(ulong)bVar6 * 3 + lVar10] =
               afStack_3c[lVar10] + local_88[(ulong)bVar6 * 3 + lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar10 != 3);
        local_128[bVar6] = fVar37 + local_128[bVar6];
        lVar26 = lVar26 + 1;
      } while (lVar26 != 7);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 7);
    lVar9 = 0;
    do {
      *(float *)((long)&local_d8 + lVar9 * 4) = local_88[lVar9] / local_128[0];
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
    fStack_160 = (float)uStack_d0;
    local_168 = local_d8;
    lVar9 = 0;
    do {
      *(float *)((long)&local_d8 + lVar9 * 4) = local_88[lVar9 + 3] / local_128[1];
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
    local_154 = (float)uStack_d0;
    uStack_15c = local_d8;
    bVar14 = bVar14 & -(local_128[1] != 0.0) & -(local_128[0] != 0.0);
    iVar31 = iVar31 + 1;
  } while (iVar31 != 4);
  if (bVar14 == 0) {
    fStack_160 = local_170;
    local_168 = local_178;
    local_154 = local_170;
    uStack_15c = local_178;
  }
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uStack_15c;
  auVar38 = insertps(auVar38,local_154,0x20);
  local_100 = (uint)((float)local_168 + 0.5);
  local_f8 = (uint)(local_168._4_4_ + 0.5);
  uVar19 = (uint)(fStack_160 + 0.5);
  local_104 = (uint)(auVar38._0_4_ + 0.5);
  local_fc = (uint)(auVar38._4_4_ + 0.5);
  uVar33 = (uint)(auVar38._8_4_ + 0.5);
  pfVar23 = local_88;
  local_88[0xc] = 0.0;
  local_88[0xd] = 0.0;
  local_88[0xe] = 0.0;
  local_88[0xf] = 0.0;
  local_88[8] = 0.0;
  local_88[9] = 0.0;
  local_88[10] = 0.0;
  local_88[0xb] = 0.0;
  local_88[4] = 0.0;
  local_88[5] = 0.0;
  local_88[6] = 0.0;
  local_88[7] = 0.0;
  local_88[0] = 0.0;
  local_88[1] = 0.0;
  local_88[2] = 0.0;
  local_88[3] = 0.0;
  local_148 = 0xff;
  if (local_100 < 0xff) {
    local_148 = (ulong)local_100;
  }
  local_140 = 0xff;
  if (local_f8 < 0xff) {
    local_140 = (uint64_t)local_f8;
  }
  uVar17 = 0xff;
  if (uVar19 < 0xff) {
    uVar17 = (ulong)uVar19;
  }
  local_e0 = 0xff;
  if (local_104 < 0xff) {
    local_e0 = (ulong)local_104;
  }
  local_120 = 0xff;
  if (local_fc < 0xff) {
    local_120 = (ulong)local_fc;
  }
  local_88[0x10] = 0.0;
  local_88[0x11] = 0.0;
  local_e8 = 0xff;
  if (uVar33 < 0xff) {
    local_e8 = (ulong)uVar33;
  }
  uVar34 = this->m_block_width;
  uVar3 = this->m_block_height;
  uVar27 = (this->m_blocks).m_width;
  uVar29 = (this->m_blocks).m_height;
  uVar15 = (this->m_blocks).m_values.m_size;
  ppVar5 = (this->m_blocks).m_values.m_p;
  lVar9 = -1;
  do {
    uVar16 = (int)lVar9 + by;
    lVar9 = lVar9 + 1;
    lVar26 = 0;
    uVar8 = bx - 1;
    do {
      if ((int)uVar8 < 0) {
        uVar24 = (int)uVar8 % (int)uVar34 + uVar34;
        if ((int)uVar8 % (int)uVar34 == 0) {
          uVar24 = 0;
        }
      }
      else {
        uVar24 = uVar8;
        if ((int)uVar34 <= (int)uVar8) {
          uVar24 = (int)uVar8 % (int)uVar34;
        }
      }
      if ((int)uVar16 < 0) {
        uVar20 = (int)uVar16 % (int)uVar3 + uVar3;
        if ((int)uVar16 % (int)uVar3 == 0) {
          uVar20 = 0;
        }
      }
      else {
        uVar20 = uVar16;
        if ((int)uVar3 <= (int)uVar16) {
          uVar20 = (int)uVar16 % (int)uVar3;
        }
      }
      if ((uVar27 <= uVar24) || (uVar29 <= uVar20)) goto LAB_0024bed2;
      uVar24 = uVar20 * uVar27 + uVar24;
      if (uVar15 <= uVar24) goto LAB_0024bef1;
      *(pvrtc4_block *)((long)pfVar23 + lVar26) = ppVar5[uVar24];
      uVar8 = uVar8 + 1;
      lVar26 = lVar26 + 0x18;
    } while (lVar26 != 0x48);
    pfVar23 = pfVar23 + 2;
  } while (lVar9 != 2);
  uVar25 = local_148;
  if ((int)local_100 < 0) {
    uVar25 = 0;
  }
  uVar32 = local_e0;
  if ((int)local_104 < 0) {
    uVar32 = 0;
  }
  uVar11 = local_140;
  if ((int)local_f8 < 0) {
    uVar11 = 0;
  }
  uVar30 = local_120;
  if ((int)local_fc < 0) {
    uVar30 = 0;
  }
  if ((int)uVar19 < 0) {
    uVar17 = 0;
  }
  if ((bx < uVar27) && (by < uVar29)) {
    uVar19 = uVar27 * by + bx;
    if (uVar19 < uVar15) {
      bVar14 = g_pvrtc_5_nearest[uVar32];
      bVar1 = g_pvrtc_5_nearest[uVar30];
      bVar2 = g_pvrtc_5_nearest[uVar17];
      uVar27 = (uint)(byte)g_pvrtc_5_nearest[uVar11] << 5 |
               (uint)(byte)g_pvrtc_5_nearest[uVar25] << 10;
      ppVar5[uVar19].m_endpoints =
           (ppVar5[uVar19].m_endpoints & 0xffff0001) + (uint)(byte)g_pvrtc_4_nearest[uVar17] * 2 |
           uVar27 | 0x8000;
      uVar19 = (this->m_blocks).m_width;
      if ((uVar19 <= bx) || ((this->m_blocks).m_height <= by)) goto LAB_0024bed2;
      uVar19 = uVar19 * by + bx;
      if (uVar19 < (this->m_blocks).m_values.m_size) {
        ppVar5 = (this->m_blocks).m_values.m_p;
        uVar29 = (uint)bVar1 << 5 | (uint)bVar14 << 10;
        local_148 = (ulong)uVar29;
        local_120 = (ulong)(uint)bVar2;
        ppVar5[uVar19].m_endpoints =
             (uVar29 | bVar2) << 0x10 | (uint)(ushort)ppVar5[uVar19].m_endpoints | 0x80000000;
        bVar6 = local_f4._0_1_;
        uVar11 = remap_pixels_influenced_by_endpoint(this,bx,by,orig_img,local_f4._0_1_,false);
        this_00 = local_118;
        puVar28 = &local_d8;
        local_a8 = 0;
        uStack_a0 = 0;
        local_b8 = 0;
        uStack_b0 = 0;
        local_c8 = 0;
        uStack_c0 = 0;
        local_d8 = 0;
        uStack_d0 = 0;
        local_98 = 0;
        uVar34 = this->m_block_width;
        uVar3 = this->m_block_height;
        uVar19 = (this->m_blocks).m_width;
        uVar29 = (this->m_blocks).m_height;
        uVar15 = (this->m_blocks).m_values.m_size;
        ppVar5 = (this->m_blocks).m_values.m_p;
        lVar9 = -1;
        do {
          uVar8 = (uint)local_130;
          uVar24 = (int)lVar9 + uVar8;
          lVar9 = lVar9 + 1;
          lVar26 = 0;
          uVar16 = bx - 1;
          do {
            if ((int)uVar16 < 0) {
              uVar20 = (int)uVar16 % (int)uVar34 + uVar34;
              if ((int)uVar16 % (int)uVar34 == 0) {
                uVar20 = 0;
              }
            }
            else {
              uVar20 = uVar16;
              if ((int)uVar34 <= (int)uVar16) {
                uVar20 = (int)uVar16 % (int)uVar34;
              }
            }
            if ((int)uVar24 < 0) {
              uVar21 = (int)uVar24 % (int)uVar3 + uVar3;
              if ((int)uVar24 % (int)uVar3 == 0) {
                uVar21 = 0;
              }
            }
            else {
              uVar21 = uVar24;
              if ((int)uVar3 <= (int)uVar24) {
                uVar21 = (int)uVar24 % (int)uVar3;
              }
            }
            local_140 = uVar11;
            if ((uVar19 <= uVar20) || (uVar29 <= uVar21)) goto LAB_0024bed2;
            uVar20 = uVar21 * uVar19 + uVar20;
            if (uVar15 <= uVar20) goto LAB_0024bef1;
            *(pvrtc4_block *)((long)puVar28 + lVar26) = ppVar5[uVar20];
            uVar16 = uVar16 + 1;
            lVar26 = lVar26 + 0x18;
          } while (lVar26 != 0x48);
          puVar28 = puVar28 + 1;
        } while (lVar9 != 2);
        uVar17 = local_e8 & 0xffffffff;
        if ((int)uVar33 < 0) {
          uVar17 = 0;
        }
        uVar34 = (uint32_t)local_110;
        if ((uVar19 <= uVar34) || (uVar29 <= uVar8)) goto LAB_0024bed2;
        uVar19 = uVar19 * uVar8 + uVar34;
        if (uVar19 < uVar15) {
          ppVar5[uVar19].m_endpoints =
               (uint)local_148 |
               (ppVar5[uVar19].m_endpoints & 0xffff0001) + (uint)(byte)g_pvrtc_4_nearest[uVar17] * 2
               | 0x8000;
          uVar19 = (local_118->m_blocks).m_width;
          if ((uVar19 <= uVar34) || ((local_118->m_blocks).m_height <= uVar8)) goto LAB_0024bed2;
          uVar19 = uVar19 * uVar8 + uVar34;
          if (uVar19 < (local_118->m_blocks).m_values.m_size) {
            ppVar5 = (local_118->m_blocks).m_values.m_p;
            ppVar5[uVar19].m_endpoints =
                 (uVar27 | (uint)local_120) << 0x10 | (uint)(ushort)ppVar5[uVar19].m_endpoints |
                 0x80000000;
            uVar12 = remap_pixels_influenced_by_endpoint
                               (local_118,uVar34,uVar8,local_138,bVar6,false);
            uVar13 = uVar12;
            if (uVar11 < uVar12) {
              uVar13 = uVar11;
            }
            if (uVar13 <= local_f0) {
              if (uVar12 <= uVar11) {
                uVar11 = evaluate_1x1_endpoint_error(this_00,uVar34,uVar8,local_138,bVar6,false,0);
                if (uVar12 == uVar11) {
                  return uVar12;
                }
                __assert_fail("e03_err_1 == evaluate_1x1_endpoint_error(bx, by, orig_img, perceptual, false)"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_pvrtc1_4.cpp"
                              ,0x230,
                              "uint64_t basisu::pvrtc4_image::local_endpoint_optimization_opaque(uint32_t, uint32_t, const image &, bool)"
                             );
              }
              lVar9 = -1;
              puVar28 = &local_d8;
              do {
                uVar33 = (int)lVar9 + uVar8;
                lVar9 = lVar9 + 1;
                lVar26 = 0;
                uVar19 = uVar34 - 1;
                do {
                  uVar3 = this_00->m_block_width;
                  if ((int)uVar19 < 0) {
                    uVar27 = uVar3 + (int)uVar19 % (int)uVar3;
                    if ((int)uVar19 % (int)uVar3 == 0) {
                      uVar27 = 0;
                    }
                  }
                  else {
                    uVar27 = uVar19;
                    if ((int)uVar3 <= (int)uVar19) {
                      uVar27 = (int)uVar19 % (int)uVar3;
                    }
                  }
                  uVar3 = this_00->m_block_height;
                  if ((int)uVar33 < 0) {
                    uVar29 = uVar3 + (int)uVar33 % (int)uVar3;
                    if ((int)uVar33 % (int)uVar3 == 0) {
                      uVar29 = 0;
                    }
                  }
                  else {
                    uVar29 = uVar33;
                    if ((int)uVar3 <= (int)uVar33) {
                      uVar29 = (int)uVar33 % (int)uVar3;
                    }
                  }
                  uVar15 = (this_00->m_blocks).m_width;
                  if ((uVar15 <= uVar27) || ((this_00->m_blocks).m_height <= uVar29))
                  goto LAB_0024bed2;
                  uVar27 = uVar15 * uVar29 + uVar27;
                  if ((this_00->m_blocks).m_values.m_size <= uVar27) goto LAB_0024bef1;
                  (this_00->m_blocks).m_values.m_p[uVar27] =
                       *(pvrtc4_block *)((long)puVar28 + lVar26);
                  uVar19 = uVar19 + 1;
                  lVar26 = lVar26 + 0x18;
                } while (lVar26 != 0x48);
                puVar28 = puVar28 + 1;
                if (lVar9 == 2) {
                  uVar13 = evaluate_1x1_endpoint_error(this_00,uVar34,uVar8,local_138,bVar6,false,0)
                  ;
                  if (uVar11 == uVar13) {
                    return uVar11;
                  }
                  __assert_fail("e03_err_0 == evaluate_1x1_endpoint_error(bx, by, orig_img, perceptual, false)"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_pvrtc1_4.cpp"
                                ,0x22c,
                                "uint64_t basisu::pvrtc4_image::local_endpoint_optimization_opaque(uint32_t, uint32_t, const image &, bool)"
                               );
                }
              } while( true );
            }
            lVar9 = -1;
            pfVar23 = local_88;
            do {
              uVar33 = (int)lVar9 + uVar8;
              lVar9 = lVar9 + 1;
              lVar26 = 0;
              uVar19 = uVar34 - 1;
              do {
                uVar3 = this_00->m_block_width;
                if ((int)uVar19 < 0) {
                  uVar27 = uVar3 + (int)uVar19 % (int)uVar3;
                  if ((int)uVar19 % (int)uVar3 == 0) {
                    uVar27 = 0;
                  }
                }
                else {
                  uVar27 = uVar19;
                  if ((int)uVar3 <= (int)uVar19) {
                    uVar27 = (int)uVar19 % (int)uVar3;
                  }
                }
                uVar3 = this_00->m_block_height;
                if ((int)uVar33 < 0) {
                  uVar29 = uVar3 + (int)uVar33 % (int)uVar3;
                  if ((int)uVar33 % (int)uVar3 == 0) {
                    uVar29 = 0;
                  }
                }
                else {
                  uVar29 = uVar33;
                  if ((int)uVar3 <= (int)uVar33) {
                    uVar29 = (int)uVar33 % (int)uVar3;
                  }
                }
                uVar15 = (this_00->m_blocks).m_width;
                if ((uVar15 <= uVar27) || ((this_00->m_blocks).m_height <= uVar29))
                goto LAB_0024bed2;
                uVar27 = uVar15 * uVar29 + uVar27;
                if ((this_00->m_blocks).m_values.m_size <= uVar27) goto LAB_0024bef1;
                (this_00->m_blocks).m_values.m_p[uVar27] = *(pvrtc4_block *)((long)pfVar23 + lVar26)
                ;
                uVar19 = uVar19 + 1;
                lVar26 = lVar26 + 0x18;
              } while (lVar26 != 0x48);
              pfVar23 = pfVar23 + 2;
              if (lVar9 == 2) {
                return local_f0;
              }
            } while( true );
          }
        }
      }
    }
LAB_0024bef1:
    __assert_fail("i < m_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                  ,0x178,
                  "T &basisu::vector<basisu::pvrtc4_block>::operator[](size_t) [T = basisu::pvrtc4_block]"
                 );
  }
LAB_0024bed2:
  __assert_fail("x < m_width && y < m_height",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                ,0xd2a,
                "T &basisu::vector2D<basisu::pvrtc4_block>::operator()(uint32_t, uint32_t) [T = basisu::pvrtc4_block]"
               );
}

Assistant:

uint64_t pvrtc4_image::local_endpoint_optimization_opaque(uint32_t bx, uint32_t by, const image& orig_img, bool perceptual)
	{
		uint64_t initial_error = evaluate_1x1_endpoint_error(bx, by, orig_img, perceptual, false);
		if (!initial_error)
			return initial_error;

		vec3F c_avg_orig(0);

		for (int y = 0; y < 7; y++)
		{
			const uint32_t py = wrap_y(by * 4 + y - 1);
			for (uint32_t x = 0; x < 7; x++)
			{
				const uint32_t px = wrap_x(bx * 4 + x - 1);

				const color_rgba& c = orig_img(px, py);

				c_avg_orig[0] += c[0];
				c_avg_orig[1] += c[1];
				c_avg_orig[2] += c[2];
			}
		}

		c_avg_orig *= 1.0f / 49.0f;

		vec3F quant_colors[2];
		quant_colors[0].set(c_avg_orig);
		quant_colors[0] -= vec3F(.0125f);

		quant_colors[1].set(c_avg_orig);
		quant_colors[1] += vec3F(.0125f);

		float total_weight[2];

		bool success = true;

		for (uint32_t pass = 0; pass < 4; pass++)
		{
			vec3F new_colors[2] = { vec3F(0), vec3F(0) };
			memset(total_weight, 0, sizeof(total_weight));

			static const float s_weights[7][7] =
			{
				{ 1.000000f, 1.637089f, 2.080362f, 2.242640f, 2.080362f, 1.637089f, 1.000000f },
				{ 1.637089f, 2.414213f, 3.006572f, 3.242640f, 3.006572f, 2.414213f, 1.637089f },
				{ 2.080362f, 3.006572f, 3.828426f, 4.242640f, 3.828426f, 3.006572f, 2.080362f },
				{ 2.242640f, 3.242640f, 4.242640f, 5.000000f, 4.242640f, 3.242640f, 2.242640f },
				{ 2.080362f, 3.006572f, 3.828426f, 4.242640f, 3.828426f, 3.006572f, 2.080362f },
				{ 1.637089f, 2.414213f, 3.006572f, 3.242640f, 3.006572f, 2.414213f, 1.637089f },
				{ 1.000000f, 1.637089f, 2.080362f, 2.242640f, 2.080362f, 1.637089f, 1.000000f }
			};

			for (int y = 0; y < 7; y++)
			{
				const uint32_t py = wrap_y(by * 4 + y - 1);
				for (uint32_t x = 0; x < 7; x++)
				{
					const uint32_t px = wrap_x(bx * 4 + x - 1);

					const color_rgba& orig_c = orig_img(px, py);

					vec3F color(orig_c[0], orig_c[1], orig_c[2]);

					uint32_t c = quant_colors[0].squared_distance(color) > quant_colors[1].squared_distance(color);

					const float weight = s_weights[y][x];
					new_colors[c] += color * weight;

					total_weight[c] += weight;
				}
			}

			if (!total_weight[0] || !total_weight[1])
				success = false;

			quant_colors[0] = new_colors[0] / (float)total_weight[0];
			quant_colors[1] = new_colors[1] / (float)total_weight[1];
		}

		if (!success)
		{
			quant_colors[0] = c_avg_orig;
			quant_colors[1] = c_avg_orig;
		}

		vec4F colors[2] = { quant_colors[0], quant_colors[1] };

		colors[0] += vec3F(.5f);
		colors[1] += vec3F(.5f);
		color_rgba color_0((int)colors[0][0], (int)colors[0][1], (int)colors[0][2], 0);
		color_rgba color_1((int)colors[1][0], (int)colors[1][1], (int)colors[1][2], 0);

		pvrtc4_block cur_blocks[3][3];
		
		for (int y = -1; y <= 1; y++)
		{
			for (int x = -1; x <= 1; x++)
			{
				const uint32_t block_x = wrap_block_x(bx + x);
				const uint32_t block_y = wrap_block_y(by + y);
				cur_blocks[x + 1][y + 1] = m_blocks(block_x, block_y);
			}
		}

		color_rgba l1(0), h1(0);

		l1[0] = g_pvrtc_5_nearest[color_0[0]];
		h1[0] = g_pvrtc_5_nearest[color_1[0]];

		l1[1] = g_pvrtc_5_nearest[color_0[1]];
		h1[1] = g_pvrtc_5_nearest[color_1[1]];

		l1[2] = g_pvrtc_4_nearest[color_0[2]];
		h1[2] = g_pvrtc_5_nearest[color_0[2]];

		l1[3] = 0;
		h1[3] = 0;

		m_blocks(bx, by).set_endpoint_raw(0, l1, true);
		m_blocks(bx, by).set_endpoint_raw(1, h1, true);

		uint64_t e03_err_0 = remap_pixels_influenced_by_endpoint(bx, by, orig_img, perceptual, false);

		pvrtc4_block blocks0[3][3];
		for (int y = -1; y <= 1; y++)
		{
			for (int x = -1; x <= 1; x++)
			{
				const uint32_t block_x = wrap_block_x(bx + x);
				const uint32_t block_y = wrap_block_y(by + y);
				blocks0[x + 1][y + 1] = m_blocks(block_x, block_y);
			}
		}

		l1[0] = g_pvrtc_5_nearest[color_1[0]];
		h1[0] = g_pvrtc_5_nearest[color_0[0]];

		l1[1] = g_pvrtc_5_nearest[color_1[1]];
		h1[1] = g_pvrtc_5_nearest[color_0[1]];

		l1[2] = g_pvrtc_4_nearest[color_1[2]];
		h1[2] = g_pvrtc_5_nearest[color_0[2]];

		l1[3] = 0;
		h1[3] = 0;

		m_blocks(bx, by).set_endpoint_raw(0, l1, true);
		m_blocks(bx, by).set_endpoint_raw(1, h1, true);

		uint64_t e03_err_1 = remap_pixels_influenced_by_endpoint(bx, by, orig_img, perceptual, false);

		if (initial_error < basisu::minimum(e03_err_0, e03_err_1))
		{
			for (int y = -1; y <= 1; y++)
			{
				for (int x = -1; x <= 1; x++)
				{
					const uint32_t block_x = wrap_block_x(bx + x);
					const uint32_t block_y = wrap_block_y(by + y);
					m_blocks(block_x, block_y) = cur_blocks[x + 1][y + 1];
				}
			}
			return initial_error;
		}
		else if (e03_err_0 < e03_err_1)
		{
			for (int y = -1; y <= 1; y++)
			{
				for (int x = -1; x <= 1; x++)
				{
					const uint32_t block_x = wrap_block_x(bx + x);
					const uint32_t block_y = wrap_block_y(by + y);
					m_blocks(block_x, block_y) = blocks0[x + 1][y + 1];
				}
			}
			assert(e03_err_0 == evaluate_1x1_endpoint_error(bx, by, orig_img, perceptual, false));
			return e03_err_0;
		}

		assert(e03_err_1 == evaluate_1x1_endpoint_error(bx, by, orig_img, perceptual, false));
		return e03_err_1;
	}